

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int beagleUpdatePrePartialsByPartition
              (int instance,BeagleOperationByPartition *operations,int operationCount)

{
  BeagleImpl *pBVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int returnValue;
  BeagleImpl *beagleInstance;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  pBVar1 = beagle::getBeagleInstance(in_stack_ffffffffffffffdc);
  if (pBVar1 == (BeagleImpl *)0x0) {
    local_4 = -4;
  }
  else {
    local_4 = (**(code **)(*(long *)pBVar1 + 0xf0))(pBVar1,in_RSI,in_EDX);
  }
  return local_4;
}

Assistant:

int beagleUpdatePrePartialsByPartition(const int instance,
                                       const BeagleOperationByPartition* operations,
                                       int operationCount) {
    DEBUG_START_TIME();
    beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
    if (beagleInstance == NULL)
        return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
    int returnValue = beagleInstance->updatePrePartialsByPartition((const int*)operations, operationCount);
    DEBUG_END_TIME();
    return returnValue;
}